

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_test.cpp
# Opt level: O0

int __thiscall ot::commissioner::MockSocket::Receive(MockSocket *this,ByteArray *aBuf)

{
  undefined8 this_00;
  bool bVar1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_230;
  const_iterator local_228;
  int local_21c;
  uchar local_218 [4];
  int rval;
  uint8_t buf [512];
  ByteArray *aBuf_local;
  MockSocket *this_local;
  
  buf._504_8_ = aBuf;
  while (local_21c = (*(this->super_Socket)._vptr_Socket[7])(this,local_218,0x200),
        this_00 = buf._504_8_, 0 < local_21c) {
    local_230._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)buf._504_8_);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_228,&local_230);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,local_228,local_218,
               local_218 + local_21c);
  }
  if ((local_21c == -0x6900) &&
     (bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)buf._504_8_),
     !bVar1)) {
    local_21c = 0;
  }
  return local_21c;
}

Assistant:

int MockSocket::Receive(ByteArray &aBuf)
{
    uint8_t buf[512];
    int     rval;

    while ((rval = Receive(buf, sizeof(buf))) > 0)
    {
        aBuf.insert(aBuf.end(), buf, buf + rval);
    }

    VerifyOrExit(rval != MBEDTLS_ERR_SSL_WANT_READ || aBuf.empty(), rval = 0);

exit:
    return rval;
}